

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params *params,U64 pledgedSrcSize,size_t loadedDictSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  ldmParams_t *params_00;
  ZSTD_compressionParameters *cParams;
  int *piVar1;
  U32 *pUVar2;
  ZSTD_cwksp_alloc_phase_e ZVar3;
  undefined4 uVar4;
  undefined4 uVar9;
  size_t sVar5;
  ZSTD_freeFunction p_Var6;
  ZSTD_allocFunction p_Var7;
  ZSTD_compressedBlockState_t *pZVar8;
  bool bVar10;
  undefined4 uVar11;
  ldmParams_t params_01;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  uint uVar15;
  uint uVar16;
  ZSTD_strategy ZVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  size_t sVar23;
  size_t sVar24;
  void *pvVar25;
  U32 *pUVar26;
  BYTE *pBVar27;
  char *pcVar28;
  ulong uVar29;
  ulong uVar30;
  void *pvVar31;
  ZSTD_compressedBlockState_t *pZVar32;
  seqDef *psVar33;
  ZSTD_Sequence *pZVar34;
  long lVar35;
  size_t sVar36;
  ZSTD_indexResetPolicy_e forceResetIndex;
  ulong uVar37;
  rawSeq *prVar38;
  ulong maxChunkSize;
  ldmEntry_t *__s;
  size_t sVar39;
  size_t err_code;
  bool bVar40;
  size_t local_70;
  size_t local_60;
  
  zc->isFirstBlock = 1;
  switchD_015ff80e::default(&zc->appliedParams,params,0xd8);
  params_00 = &(zc->appliedParams).ldmParams;
  if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    ZSTD_ldm_adjustParameters(params_00,&(zc->appliedParams).cParams);
  }
  uVar37 = 1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f);
  if (pledgedSrcSize <= uVar37) {
    uVar37 = pledgedSrcSize;
  }
  if (pledgedSrcSize == 0) {
    uVar37 = 1;
  }
  maxChunkSize = (zc->appliedParams).maxBlockSize;
  if (uVar37 <= maxChunkSize) {
    maxChunkSize = uVar37;
  }
  uVar29 = 4 - (ulong)((zc->appliedParams).cParams.minMatch == 3 ||
                      (zc->appliedParams).extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0);
  local_70 = 0;
  uVar22 = maxChunkSize / uVar29;
  if (zbuff == ZSTDb_buffered) {
    if ((zc->appliedParams).outBufferMode == ZSTD_bm_buffered) {
      if (maxChunkSize < 0xff00ff00ff00ff00) {
        uVar30 = 0;
        if (maxChunkSize < 0x20000) {
          uVar30 = -(maxChunkSize - 0x20000) >> 0xb;
        }
        lVar35 = (maxChunkSize >> 8) + maxChunkSize + uVar30;
      }
      else {
        lVar35 = 0;
      }
      local_70 = 0xffffffffffffffb9;
      if (lVar35 != 0) {
        local_70 = lVar35 + 1;
      }
    }
    else {
      local_70 = 0;
    }
  }
  if (zbuff == ZSTDb_buffered) {
    local_60 = 0;
    if ((zc->appliedParams).inBufferMode == ZSTD_bm_buffered) {
      local_60 = uVar37 + maxChunkSize;
    }
  }
  else {
    local_60 = 0;
  }
  cParams = &(zc->appliedParams).cParams;
  uVar4 = (zc->appliedParams).ldmParams.hashRateLog;
  uVar9 = (zc->appliedParams).ldmParams.windowLog;
  params_01.windowLog = uVar9;
  params_01.hashRateLog = uVar4;
  uVar11 = (zc->appliedParams).ldmParams.minMatchLength;
  uVar12 = params_00->enableLdm;
  uVar13 = params_00->hashLog;
  uVar14 = params_00->bucketSizeLog;
  params_01.bucketSizeLog = uVar14;
  params_01.hashLog = uVar13;
  params_01.enableLdm = uVar12;
  params_01.minMatchLength = uVar11;
  sVar23 = ZSTD_ldm_getMaxNbSeq(params_01,maxChunkSize);
  forceResetIndex = ZSTDirp_reset;
  if ((loadedDictSize < 0x20000000) &&
     ((ulong)((long)(zc->blockState).matchState.window.nextSrc -
             (long)(zc->blockState).matchState.window.base) < 0xdf000001)) {
    forceResetIndex = (ZSTD_indexResetPolicy_e)(zc->initialized == 0);
  }
  sVar24 = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                     (cParams,params_00,(uint)(zc->staticSize != 0),
                      (zc->appliedParams).useRowMatchFinder,local_60,local_70,pledgedSrcSize,
                      (uint)((zc->appliedParams).extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0),
                      (zc->appliedParams).maxBlockSize);
  if (0xffffffffffffff88 < sVar24) {
    return sVar24;
  }
  sVar5 = zc->staticSize;
  if (sVar5 == 0) {
    piVar1 = &(zc->workspace).workspaceOversizedDuration;
    *piVar1 = *piVar1 + 1;
  }
  pvVar25 = (zc->workspace).workspace;
  if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < sVar24 * 3) {
    bVar10 = false;
  }
  else {
    bVar10 = 0x80 < (zc->workspace).workspaceOversizedDuration;
  }
  bVar10 = (bool)((ulong)((long)(zc->workspace).workspaceEnd - (long)pvVar25) < sVar24 | bVar10);
  bVar40 = (bool)(bVar10 ^ 1);
  sVar39 = 0xffffffffffffffc0;
  if (!bVar10) {
    sVar39 = sVar24;
  }
  if ((sVar5 == 0) && (bVar10)) {
    p_Var6 = (zc->customMem).customFree;
    pvVar31 = (zc->customMem).opaque;
    (zc->workspace).initOnceStart = (void *)0x0;
    (zc->workspace).allocFailed = '\0';
    *(undefined3 *)&(zc->workspace).field_0x39 = 0;
    (zc->workspace).workspaceOversizedDuration = 0;
    (zc->workspace).tableValidEnd = (void *)0x0;
    (zc->workspace).allocStart = (void *)0x0;
    (zc->workspace).objectEnd = (void *)0x0;
    (zc->workspace).tableEnd = (void *)0x0;
    (zc->workspace).workspace = (void *)0x0;
    (zc->workspace).workspaceEnd = (void *)0x0;
    (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
    (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
    if (pvVar25 != (void *)0x0) {
      if (p_Var6 == (ZSTD_freeFunction)0x0) {
        free(pvVar25);
      }
      else {
        (*p_Var6)(pvVar31,pvVar25);
      }
    }
    p_Var7 = (zc->customMem).customAlloc;
    if (p_Var7 == (ZSTD_allocFunction)0x0) {
      pvVar25 = malloc(sVar24);
    }
    else {
      pvVar25 = (*p_Var7)((zc->customMem).opaque,sVar24);
    }
    if (pvVar25 == (void *)0x0) {
      sVar24 = 0xffffffffffffffc0;
    }
    else {
      (zc->workspace).workspace = pvVar25;
      (zc->workspace).workspaceEnd = (void *)(sVar24 + (long)pvVar25);
      (zc->workspace).objectEnd = pvVar25;
      (zc->workspace).tableValidEnd = pvVar25;
      pvVar31 = (void *)((ulong)(sVar24 + (long)pvVar25) & 0xffffffffffffffc0);
      (zc->workspace).initOnceStart = pvVar31;
      (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
      (zc->workspace).tableEnd = pvVar25;
      (zc->workspace).allocStart = pvVar31;
      (zc->workspace).allocFailed = '\0';
      (zc->workspace).workspaceOversizedDuration = 0;
      (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
    }
    forceResetIndex = ZSTDirp_reset;
    if (pvVar25 == (void *)0x0) {
      bVar40 = false;
      sVar39 = sVar24;
    }
    else {
      ZVar3 = (zc->workspace).phase;
      if (ZVar3 == ZSTD_cwksp_alloc_objects) {
        pZVar32 = (ZSTD_compressedBlockState_t *)(zc->workspace).objectEnd;
        pZVar8 = pZVar32 + 1;
        if ((ZSTD_compressedBlockState_t *)(zc->workspace).workspaceEnd < pZVar8) goto LAB_01d60e28;
        (zc->workspace).objectEnd = pZVar8;
        (zc->workspace).tableEnd = pZVar8;
        (zc->workspace).tableValidEnd = pZVar8;
      }
      else {
LAB_01d60e28:
        (zc->workspace).allocFailed = '\x01';
        pZVar32 = (ZSTD_compressedBlockState_t *)0x0;
      }
      (zc->blockState).prevCBlock = pZVar32;
      sVar39 = 0xffffffffffffffc0;
      if (pZVar32 != (ZSTD_compressedBlockState_t *)0x0) {
        if (ZVar3 == ZSTD_cwksp_alloc_objects) {
          pZVar32 = (ZSTD_compressedBlockState_t *)(zc->workspace).objectEnd;
          pZVar8 = pZVar32 + 1;
          if ((ZSTD_compressedBlockState_t *)(zc->workspace).workspaceEnd < pZVar8)
          goto LAB_01d60e63;
          (zc->workspace).objectEnd = pZVar8;
          (zc->workspace).tableEnd = pZVar8;
          (zc->workspace).tableValidEnd = pZVar8;
        }
        else {
LAB_01d60e63:
          (zc->workspace).allocFailed = '\x01';
          pZVar32 = (ZSTD_compressedBlockState_t *)0x0;
        }
        (zc->blockState).nextCBlock = pZVar32;
        if (pZVar32 != (ZSTD_compressedBlockState_t *)0x0) {
          if (ZVar3 == ZSTD_cwksp_alloc_objects) {
            pUVar26 = (U32 *)(zc->workspace).objectEnd;
            pUVar2 = pUVar26 + 0x8b6;
            if ((zc->workspace).workspaceEnd < pUVar2) goto LAB_01d60e97;
            (zc->workspace).objectEnd = pUVar2;
            (zc->workspace).tableEnd = pUVar2;
            (zc->workspace).tableValidEnd = pUVar2;
          }
          else {
LAB_01d60e97:
            (zc->workspace).allocFailed = '\x01';
            pUVar26 = (U32 *)0x0;
          }
          zc->entropyWorkspace = pUVar26;
          bVar40 = pUVar26 != (U32 *)0x0;
          if (bVar40) {
            sVar39 = sVar24;
          }
          goto LAB_01d60ebc;
        }
      }
      bVar40 = false;
    }
  }
LAB_01d60ebc:
  if (!bVar40) {
    return sVar39;
  }
  (zc->workspace).tableEnd = (zc->workspace).objectEnd;
  (zc->workspace).allocStart = (void *)((ulong)(zc->workspace).workspaceEnd & 0xffffffffffffffc0);
  (zc->workspace).allocFailed = '\0';
  if (1 < (int)(zc->workspace).phase) {
    (zc->workspace).phase = ZSTD_cwksp_alloc_aligned_init_once;
  }
  uVar18 = cParams->windowLog;
  uVar19 = cParams->chainLog;
  uVar20 = (zc->appliedParams).cParams.hashLog;
  uVar21 = (zc->appliedParams).cParams.searchLog;
  uVar15 = (zc->appliedParams).cParams.minMatch;
  uVar16 = (zc->appliedParams).cParams.targetLength;
  ZVar17 = (zc->appliedParams).cParams.strategy;
  (zc->blockState).matchState.cParams.searchLog = (zc->appliedParams).cParams.searchLog;
  (zc->blockState).matchState.cParams.minMatch = uVar15;
  (zc->blockState).matchState.cParams.targetLength = uVar16;
  (zc->blockState).matchState.cParams.strategy = ZVar17;
  (zc->blockState).matchState.cParams.windowLog = uVar18;
  (zc->blockState).matchState.cParams.chainLog = uVar19;
  (zc->blockState).matchState.cParams.hashLog = uVar20;
  (zc->blockState).matchState.cParams.searchLog = uVar21;
  (zc->blockState).matchState.prefetchCDictTables =
       (uint)((zc->appliedParams).prefetchCDictTables == ZSTD_ps_enable);
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = 0;
  zc->producedCSize = 0;
  if (pledgedSrcSize + 1 == 0) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = maxChunkSize;
  XXH64_reset(&zc->xxhState,0);
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  zc->dictContentSize = 0;
  pZVar8 = (zc->blockState).prevCBlock;
  pZVar8->rep[0] = 1;
  pZVar8->rep[1] = 4;
  pZVar8->rep[2] = 8;
  (pZVar8->entropy).huf.repeatMode = HUF_repeat_none;
  (pZVar8->entropy).fse.offcode_repeatMode = FSE_repeat_none;
  (pZVar8->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
  (pZVar8->entropy).fse.litlength_repeatMode = FSE_repeat_none;
  sVar24 = ZSTD_reset_matchState
                     (&(zc->blockState).matchState,&zc->workspace,cParams,
                      (zc->appliedParams).useRowMatchFinder,crp,forceResetIndex,
                      ZSTD_resetTarget_CCtx);
  if (0xffffffffffffff88 < sVar24) {
    return sVar24;
  }
  uVar37 = uVar22 * 8 + 0x3f & 0xffffffffffffffc0;
  ZVar3 = (zc->workspace).phase;
  if ((int)ZVar3 < 2) {
    if (ZVar3 != ZSTD_cwksp_alloc_aligned_init_once) {
      pvVar25 = (zc->workspace).workspaceEnd;
      pvVar31 = (zc->workspace).objectEnd;
      (zc->workspace).tableValidEnd = pvVar31;
      (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
      uVar30 = (ulong)(-(int)pvVar31 & 0x3f);
      pvVar31 = (void *)((long)pvVar31 + uVar30);
      bVar10 = true;
      if (pvVar25 < pvVar31) goto LAB_01d6108b;
      (zc->workspace).objectEnd = pvVar31;
      (zc->workspace).tableEnd = pvVar31;
      if (uVar30 != 0) {
        (zc->workspace).tableValidEnd = pvVar31;
      }
    }
    (zc->workspace).phase = ZSTD_cwksp_alloc_aligned;
    bVar10 = false;
  }
  else {
    bVar10 = false;
  }
LAB_01d6108b:
  if (uVar37 == 0 || bVar10) {
LAB_01d610af:
    psVar33 = (seqDef *)0x0;
  }
  else {
    psVar33 = (seqDef *)((long)(zc->workspace).allocStart - uVar37);
    if (psVar33 < (seqDef *)(zc->workspace).tableEnd) {
      (zc->workspace).allocFailed = '\x01';
      goto LAB_01d610af;
    }
    if (psVar33 < (seqDef *)(zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = psVar33;
    }
    (zc->workspace).allocStart = psVar33;
  }
  (zc->seqStore).sequencesStart = psVar33;
  if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    sVar36 = 8L << ((byte)(zc->appliedParams).ldmParams.hashLog & 0x3f);
    uVar37 = sVar36 + 0x3f & 0xffffffffffffffc0;
    ZVar3 = (zc->workspace).phase;
    if ((int)ZVar3 < 2) {
      if (ZVar3 == ZSTD_cwksp_alloc_aligned_init_once) {
LAB_01d6114e:
        (zc->workspace).phase = ZSTD_cwksp_alloc_aligned;
        goto LAB_01d61158;
      }
      pvVar25 = (zc->workspace).workspaceEnd;
      pvVar31 = (zc->workspace).objectEnd;
      (zc->workspace).tableValidEnd = pvVar31;
      (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
      uVar30 = (ulong)(-(int)pvVar31 & 0x3f);
      pvVar31 = (void *)((long)pvVar31 + uVar30);
      bVar10 = true;
      if (pvVar31 <= pvVar25) {
        (zc->workspace).objectEnd = pvVar31;
        (zc->workspace).tableEnd = pvVar31;
        if (uVar30 != 0) {
          (zc->workspace).tableValidEnd = pvVar31;
        }
        goto LAB_01d6114e;
      }
    }
    else {
LAB_01d61158:
      bVar10 = false;
    }
    if (uVar37 == 0 || bVar10) {
LAB_01d6117f:
      __s = (ldmEntry_t *)0x0;
    }
    else {
      __s = (ldmEntry_t *)((long)(zc->workspace).allocStart - uVar37);
      if (__s < (ldmEntry_t *)(zc->workspace).tableEnd) {
        (zc->workspace).allocFailed = '\x01';
        goto LAB_01d6117f;
      }
      if (__s < (ldmEntry_t *)(zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = __s;
      }
      (zc->workspace).allocStart = __s;
    }
    (zc->ldmState).hashTable = __s;
    bVar10 = false;
    switchD_0105b559::default(__s,0,sVar36);
    uVar37 = sVar23 * 0xc + 0x3f & 0xffffffffffffffc0;
    ZVar3 = (zc->workspace).phase;
    if ((int)ZVar3 < 2) {
      if (ZVar3 != ZSTD_cwksp_alloc_aligned_init_once) {
        pvVar25 = (zc->workspace).workspaceEnd;
        pvVar31 = (zc->workspace).objectEnd;
        (zc->workspace).tableValidEnd = pvVar31;
        (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
        uVar30 = (ulong)(-(int)pvVar31 & 0x3f);
        pvVar31 = (void *)((long)pvVar31 + uVar30);
        bVar10 = true;
        if (pvVar25 < pvVar31) goto LAB_01d61259;
        (zc->workspace).objectEnd = pvVar31;
        (zc->workspace).tableEnd = pvVar31;
        if (uVar30 != 0) {
          (zc->workspace).tableValidEnd = pvVar31;
        }
      }
      (zc->workspace).phase = ZSTD_cwksp_alloc_aligned;
      bVar10 = false;
    }
LAB_01d61259:
    if (uVar37 == 0 || bVar10) {
      prVar38 = (rawSeq *)0x0;
    }
    else {
      prVar38 = (rawSeq *)((long)(zc->workspace).allocStart - uVar37);
      if (prVar38 < (rawSeq *)(zc->workspace).tableEnd) {
        (zc->workspace).allocFailed = '\x01';
        prVar38 = (rawSeq *)0x0;
      }
      else {
        if (prVar38 < (rawSeq *)(zc->workspace).tableValidEnd) {
          (zc->workspace).tableValidEnd = prVar38;
        }
        (zc->workspace).allocStart = prVar38;
      }
    }
    zc->ldmSequences = prVar38;
    zc->maxNbLdmSequences = sVar23;
    (zc->ldmState).window.dictBase = (BYTE *)0x0;
    (zc->ldmState).window.dictLimit = 0;
    (zc->ldmState).window.lowLimit = 0;
    (zc->ldmState).window.nextSrc = (BYTE *)0x0;
    (zc->ldmState).window.base = (BYTE *)0x0;
    *(undefined8 *)&(zc->ldmState).window.nbOverflowCorrections = 0;
    (zc->ldmState).window.base = " ";
    (zc->ldmState).window.dictBase = " ";
    (zc->ldmState).window.dictLimit = 2;
    (zc->ldmState).window.lowLimit = 2;
    (zc->ldmState).window.nextSrc = (BYTE *)"id-ce-certificatePolicies";
    (zc->ldmState).window.nbOverflowCorrections = 0;
    (zc->ldmState).loadedDictEnd = 0;
  }
  if ((zc->appliedParams).extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0) {
    sVar23 = (maxChunkSize >> 10) + maxChunkSize / 3 + 2;
    zc->extSeqBufCapacity = sVar23;
    uVar37 = sVar23 * 0x10 + 0x3f & 0xffffffffffffffc0;
    ZVar3 = (zc->workspace).phase;
    if ((int)ZVar3 < 2) {
      if (ZVar3 == ZSTD_cwksp_alloc_aligned_init_once) {
LAB_01d613ac:
        (zc->workspace).phase = ZSTD_cwksp_alloc_aligned;
        goto LAB_01d613b6;
      }
      pvVar25 = (zc->workspace).workspaceEnd;
      pvVar31 = (zc->workspace).objectEnd;
      (zc->workspace).tableValidEnd = pvVar31;
      (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
      uVar30 = (ulong)(-(int)pvVar31 & 0x3f);
      pvVar31 = (void *)((long)pvVar31 + uVar30);
      bVar10 = true;
      if (pvVar31 <= pvVar25) {
        (zc->workspace).objectEnd = pvVar31;
        (zc->workspace).tableEnd = pvVar31;
        if (uVar30 != 0) {
          (zc->workspace).tableValidEnd = pvVar31;
        }
        goto LAB_01d613ac;
      }
    }
    else {
LAB_01d613b6:
      bVar10 = false;
    }
    if (uVar37 == 0 || bVar10) {
LAB_01d613dc:
      pZVar34 = (ZSTD_Sequence *)0x0;
    }
    else {
      pZVar34 = (ZSTD_Sequence *)((long)(zc->workspace).allocStart - uVar37);
      if (pZVar34 < (ZSTD_Sequence *)(zc->workspace).tableEnd) {
        (zc->workspace).allocFailed = '\x01';
        goto LAB_01d613dc;
      }
      if (pZVar34 < (ZSTD_Sequence *)(zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pZVar34;
      }
      (zc->workspace).allocStart = pZVar34;
    }
    zc->extSeqBuf = pZVar34;
  }
  ZVar3 = (zc->workspace).phase;
  if ((int)ZVar3 < 3) {
    if (0 < (int)ZVar3) {
LAB_01d61411:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      goto LAB_01d6141b;
    }
    pvVar25 = (zc->workspace).workspaceEnd;
    pvVar31 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar31;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
    uVar37 = (ulong)(-(int)pvVar31 & 0x3f);
    pvVar31 = (void *)((long)pvVar31 + uVar37);
    bVar10 = true;
    if (pvVar31 <= pvVar25) {
      (zc->workspace).objectEnd = pvVar31;
      (zc->workspace).tableEnd = pvVar31;
      if (uVar37 != 0) {
        (zc->workspace).tableValidEnd = pvVar31;
      }
      goto LAB_01d61411;
    }
  }
  else {
LAB_01d6141b:
    bVar10 = false;
  }
  if (maxChunkSize == 0xffffffffffffffe0 || bVar10) {
LAB_01d61446:
    pBVar27 = (BYTE *)0x0;
  }
  else {
    pBVar27 = (BYTE *)((long)(zc->workspace).allocStart + (-0x20 - maxChunkSize));
    if (pBVar27 < (zc->workspace).tableEnd) {
      (zc->workspace).allocFailed = '\x01';
      goto LAB_01d61446;
    }
    if (pBVar27 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar27;
    }
    (zc->workspace).allocStart = pBVar27;
  }
  (zc->seqStore).litStart = pBVar27;
  (zc->seqStore).maxNbLit = maxChunkSize;
  zc->bufferedPolicy = zbuff;
  zc->inBuffSize = local_60;
  ZVar3 = (zc->workspace).phase;
  if ((int)ZVar3 < 3) {
    if (0 < (int)ZVar3) {
LAB_01d61498:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      goto LAB_01d614a2;
    }
    pvVar25 = (zc->workspace).workspaceEnd;
    pvVar31 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar31;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
    uVar37 = (ulong)(-(int)pvVar31 & 0x3f);
    pvVar31 = (void *)((long)pvVar31 + uVar37);
    bVar10 = true;
    if (pvVar31 <= pvVar25) {
      (zc->workspace).objectEnd = pvVar31;
      (zc->workspace).tableEnd = pvVar31;
      if (uVar37 != 0) {
        (zc->workspace).tableValidEnd = pvVar31;
      }
      goto LAB_01d61498;
    }
  }
  else {
LAB_01d614a2:
    bVar10 = false;
  }
  if (local_60 == 0 || bVar10) {
LAB_01d614cd:
    pcVar28 = (char *)0x0;
  }
  else {
    pcVar28 = (char *)((long)(zc->workspace).allocStart - local_60);
    if (pcVar28 < (zc->workspace).tableEnd) {
      (zc->workspace).allocFailed = '\x01';
      goto LAB_01d614cd;
    }
    if (pcVar28 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pcVar28;
    }
    (zc->workspace).allocStart = pcVar28;
  }
  zc->inBuff = pcVar28;
  zc->outBuffSize = local_70;
  ZVar3 = (zc->workspace).phase;
  if ((int)ZVar3 < 3) {
    if (0 < (int)ZVar3) {
LAB_01d61509:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      goto LAB_01d61513;
    }
    pvVar25 = (zc->workspace).workspaceEnd;
    pvVar31 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar31;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
    uVar37 = (ulong)(-(int)pvVar31 & 0x3f);
    pvVar31 = (void *)((long)pvVar31 + uVar37);
    bVar10 = true;
    if (pvVar31 <= pvVar25) {
      (zc->workspace).objectEnd = pvVar31;
      (zc->workspace).tableEnd = pvVar31;
      if (uVar37 != 0) {
        (zc->workspace).tableValidEnd = pvVar31;
      }
      goto LAB_01d61509;
    }
  }
  else {
LAB_01d61513:
    bVar10 = false;
  }
  if (local_70 == 0 || bVar10) {
LAB_01d61539:
    pcVar28 = (char *)0x0;
  }
  else {
    pcVar28 = (char *)((long)(zc->workspace).allocStart - local_70);
    if (pcVar28 < (zc->workspace).tableEnd) {
      (zc->workspace).allocFailed = '\x01';
      goto LAB_01d61539;
    }
    if (pcVar28 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pcVar28;
    }
    (zc->workspace).allocStart = pcVar28;
  }
  zc->outBuff = pcVar28;
  if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    ZVar3 = (zc->workspace).phase;
    sVar36 = 1L << ((char)(zc->appliedParams).ldmParams.hashLog -
                    (char)(zc->appliedParams).ldmParams.bucketSizeLog & 0x3fU);
    if ((int)ZVar3 < 3) {
      if (0 < (int)ZVar3) {
LAB_01d6158b:
        (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
        goto LAB_01d61595;
      }
      pvVar25 = (zc->workspace).workspaceEnd;
      pvVar31 = (zc->workspace).objectEnd;
      (zc->workspace).tableValidEnd = pvVar31;
      (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
      uVar37 = (ulong)(-(int)pvVar31 & 0x3f);
      pvVar31 = (void *)((long)pvVar31 + uVar37);
      if (pvVar31 <= pvVar25) {
        (zc->workspace).objectEnd = pvVar31;
        (zc->workspace).tableEnd = pvVar31;
        if (uVar37 != 0) {
          (zc->workspace).tableValidEnd = pvVar31;
        }
        goto LAB_01d6158b;
      }
LAB_01d615af:
      pBVar27 = (BYTE *)0x0;
    }
    else {
LAB_01d61595:
      pBVar27 = (BYTE *)((long)(zc->workspace).allocStart - sVar36);
      if (pBVar27 < (zc->workspace).tableEnd) {
        (zc->workspace).allocFailed = '\x01';
        goto LAB_01d615af;
      }
      if (pBVar27 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pBVar27;
      }
      (zc->workspace).allocStart = pBVar27;
    }
    (zc->ldmState).bucketOffsets = pBVar27;
    switchD_0105b559::default(pBVar27,0,sVar36);
  }
  (zc->externSeqStore).posInSequence = 0;
  (zc->externSeqStore).size = 0;
  (zc->externSeqStore).seq = (rawSeq *)0x0;
  (zc->externSeqStore).pos = 0;
  (zc->externSeqStore).capacity = 0;
  (zc->seqStore).maxNbSeq = uVar22;
  ZVar3 = (zc->workspace).phase;
  if ((int)ZVar3 < 3) {
    if (0 < (int)ZVar3) {
LAB_01d6160e:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      goto LAB_01d61618;
    }
    pvVar25 = (zc->workspace).workspaceEnd;
    pvVar31 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar31;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
    uVar37 = (ulong)(-(int)pvVar31 & 0x3f);
    pvVar31 = (void *)((long)pvVar31 + uVar37);
    bVar10 = true;
    if (pvVar31 <= pvVar25) {
      (zc->workspace).objectEnd = pvVar31;
      (zc->workspace).tableEnd = pvVar31;
      if (uVar37 != 0) {
        (zc->workspace).tableValidEnd = pvVar31;
      }
      goto LAB_01d6160e;
    }
  }
  else {
LAB_01d61618:
    bVar10 = false;
  }
  if (maxChunkSize < uVar29 || bVar10) {
LAB_01d6163e:
    pBVar27 = (BYTE *)0x0;
  }
  else {
    pBVar27 = (BYTE *)((long)(zc->workspace).allocStart - uVar22);
    if (pBVar27 < (zc->workspace).tableEnd) {
      (zc->workspace).allocFailed = '\x01';
      goto LAB_01d6163e;
    }
    if (pBVar27 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar27;
    }
    (zc->workspace).allocStart = pBVar27;
  }
  (zc->seqStore).llCode = pBVar27;
  ZVar3 = (zc->workspace).phase;
  if ((int)ZVar3 < 3) {
    if (0 < (int)ZVar3) {
LAB_01d61673:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      goto LAB_01d6167d;
    }
    pvVar25 = (zc->workspace).workspaceEnd;
    pvVar31 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar31;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
    uVar37 = (ulong)(-(int)pvVar31 & 0x3f);
    pvVar31 = (void *)((long)pvVar31 + uVar37);
    bVar10 = true;
    if (pvVar31 <= pvVar25) {
      (zc->workspace).objectEnd = pvVar31;
      (zc->workspace).tableEnd = pvVar31;
      if (uVar37 != 0) {
        (zc->workspace).tableValidEnd = pvVar31;
      }
      goto LAB_01d61673;
    }
  }
  else {
LAB_01d6167d:
    bVar10 = false;
  }
  if (maxChunkSize < uVar29 || bVar10) {
LAB_01d616a3:
    pBVar27 = (BYTE *)0x0;
  }
  else {
    pBVar27 = (BYTE *)((long)(zc->workspace).allocStart - uVar22);
    if (pBVar27 < (zc->workspace).tableEnd) {
      (zc->workspace).allocFailed = '\x01';
      goto LAB_01d616a3;
    }
    if (pBVar27 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar27;
    }
    (zc->workspace).allocStart = pBVar27;
  }
  (zc->seqStore).mlCode = pBVar27;
  ZVar3 = (zc->workspace).phase;
  if ((int)ZVar3 < 3) {
    if (0 < (int)ZVar3) {
LAB_01d616d8:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      goto LAB_01d616e2;
    }
    pvVar25 = (zc->workspace).workspaceEnd;
    pvVar31 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar31;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
    uVar37 = (ulong)(-(int)pvVar31 & 0x3f);
    pvVar31 = (void *)((long)pvVar31 + uVar37);
    bVar10 = true;
    if (pvVar31 <= pvVar25) {
      (zc->workspace).objectEnd = pvVar31;
      (zc->workspace).tableEnd = pvVar31;
      if (uVar37 != 0) {
        (zc->workspace).tableValidEnd = pvVar31;
      }
      goto LAB_01d616d8;
    }
  }
  else {
LAB_01d616e2:
    bVar10 = false;
  }
  if (uVar29 <= maxChunkSize && !bVar10) {
    pBVar27 = (BYTE *)((long)(zc->workspace).allocStart - uVar22);
    if ((zc->workspace).tableEnd <= pBVar27) {
      if (pBVar27 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pBVar27;
      }
      (zc->workspace).allocStart = pBVar27;
      goto LAB_01d61723;
    }
    (zc->workspace).allocFailed = '\x01';
  }
  pBVar27 = (BYTE *)0x0;
LAB_01d61723:
  (zc->seqStore).ofCode = pBVar27;
  zc->initialized = 1;
  return 0;
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params const* params,
                                      U64 const pledgedSrcSize,
                                      size_t const loadedDictSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u, useRowMatchFinder=%d useBlockSplitter=%d",
                (U32)pledgedSrcSize, params->cParams.windowLog, (int)params->useRowMatchFinder, (int)params->useBlockSplitter);
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));

    zc->isFirstBlock = 1;

    /* Set applied params early so we can modify them for LDM,
     * and point params at the applied params.
     */
    zc->appliedParams = *params;
    params = &zc->appliedParams;

    assert(params->useRowMatchFinder != ZSTD_ps_auto);
    assert(params->useBlockSplitter != ZSTD_ps_auto);
    assert(params->ldmParams.enableLdm != ZSTD_ps_auto);
    assert(params->maxBlockSize != 0);
    if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&zc->appliedParams.ldmParams, &params->cParams);
        assert(params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog);
        assert(params->ldmParams.hashRateLog < 32);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params->cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(params->maxBlockSize, windowSize);
        size_t const maxNbSeq = ZSTD_maxNbSeq(blockSize, params->cParams.minMatch, ZSTD_hasExtSeqProd(params));
        size_t const buffOutSize = (zbuff == ZSTDb_buffered && params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        size_t const buffInSize = (zbuff == ZSTDb_buffered && params->inBufferMode == ZSTD_bm_buffered)
                ? windowSize + blockSize
                : 0;
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize);

        int const indexTooClose = ZSTD_indexTooCloseToMax(zc->blockState.matchState.window);
        int const dictTooBig = ZSTD_dictTooBig(loadedDictSize);
        ZSTD_indexResetPolicy_e needsIndexReset =
            (indexTooClose || dictTooBig || !zc->initialized) ? ZSTDirp_reset : ZSTDirp_continue;

        size_t const neededSpace =
            ZSTD_estimateCCtxSize_usingCCtxParams_internal(
                &params->cParams, &params->ldmParams, zc->staticSize != 0, params->useRowMatchFinder,
                buffInSize, buffOutSize, pledgedSrcSize, ZSTD_hasExtSeqProd(params), params->maxBlockSize);

        FORWARD_IF_ERROR(neededSpace, "cctx size estimate failed!");

        if (!zc->staticSize) ZSTD_cwksp_bump_oversized_duration(ws, 0);

        {   /* Check if workspace is large enough, alloc a new one if needed */
            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);
            int resizeWorkspace = workspaceTooSmall || workspaceWasteful;
            DEBUGLOG(4, "Need %zu B workspace", neededSpace);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (resizeWorkspace) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem), "");

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, ENTROPY_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->entropyWorkspace == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->blockState.matchState.cParams = params->cParams;
        zc->blockState.matchState.prefetchCDictTables = params->prefetchCDictTables == ZSTD_ps_enable;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;
        zc->dictContentSize = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
                &zc->blockState.matchState,
                ws,
                &params->cParams,
                params->useRowMatchFinder,
                crp,
                needsIndexReset,
                ZSTD_resetTarget_CCtx), "");

        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        /* ldm hash table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params->ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            ZSTD_memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            zc->ldmState.loadedDictEnd = 0;
        }

        /* reserve space for block-level external sequences */
        if (ZSTD_hasExtSeqProd(params)) {
            size_t const maxNbExternalSeq = ZSTD_sequenceBound(blockSize);
            zc->extSeqBufCapacity = maxNbExternalSeq;
            zc->extSeqBuf =
                (ZSTD_Sequence*)ZSTD_cwksp_reserve_aligned(ws, maxNbExternalSeq * sizeof(ZSTD_Sequence));
        }

        /* buffers */

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        zc->bufferedPolicy = zbuff;
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const numBuckets =
                  ((size_t)1) << (params->ldmParams.hashLog -
                                  params->ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, numBuckets);
            ZSTD_memset(zc->ldmState.bucketOffsets, 0, numBuckets);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));

        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));
        assert(ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace));

        zc->initialized = 1;

        return 0;
    }
}